

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O0

int SetUpDownOrientationPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,BOOL bUpOrientation)

{
  int iVar1;
  size_t sVar2;
  uint8 local_48 [8];
  char buf [32];
  BOOL bUpOrientation_local;
  PATHFINDERDVL *pPathfinderDVL_local;
  
  sprintf((char *)local_48,"EU%d\r",(ulong)(bUpOrientation != 0));
  sVar2 = strlen((char *)local_48);
  iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,local_48,(int)sVar2);
  if (iVar1 == 0) {
    if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
      sVar2 = strlen((char *)local_48);
      fwrite(local_48,sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    pPathfinderDVL_local._4_4_ = 0;
  }
  else {
    printf("Error writing data to a PathfinderDVL. \n");
    pPathfinderDVL_local._4_4_ = 1;
  }
  return pPathfinderDVL_local._4_4_;
}

Assistant:

inline int SetUpDownOrientationPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, BOOL bUpOrientation)
{
	char buf[MAX_NB_BYTES_COMMAND_PATHFINDERDVL];

	sprintf(buf, "EU%d\r", bUpOrientation? 1: 0);

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}

	return EXIT_SUCCESS;
}